

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O0

int ffcpcl(fitsfile *infptr,fitsfile *outfptr,int incol,int outcol,int create_col,int *status)

{
  int iVar1;
  int iVar2;
  long *__nmemb;
  void *pvVar3;
  int in_ECX;
  int in_EDX;
  int *in_RSI;
  int *in_RDI;
  int in_R8D;
  double *in_R9;
  unsigned_long_long *ujjvalues;
  longlong *jjvalues;
  float *fvalues;
  float fnull;
  double *dvalues;
  double dnull;
  char nulstr [2];
  char **strarray;
  char nullflag;
  char *lvalues;
  char tform_comm [73];
  char ttype_comm [73];
  char tform [71];
  char ttype [71];
  char keyname [75];
  long ii;
  long firstelem;
  long firstrow;
  long npixels;
  long ntodo;
  long ndone;
  long maxloop;
  long outloop;
  long inloop;
  long outrows;
  long nrows;
  long owidth;
  long width;
  long orepeat;
  long repeat;
  long tfields;
  int outHduType;
  int inHduType;
  int anynull;
  int etypecode;
  int otypecode;
  int typecode;
  int colnum;
  int tstatus;
  double *in_stack_00006f80;
  LONGLONG in_stack_00006f88;
  LONGLONG in_stack_00006f90;
  LONGLONG in_stack_00006f98;
  int in_stack_00006fa4;
  fitsfile *in_stack_00006fa8;
  char **in_stack_00006fb0;
  LONGLONG in_stack_00006fb8;
  LONGLONG in_stack_00006fc0;
  LONGLONG in_stack_00006fc8;
  int in_stack_00006fd4;
  fitsfile *in_stack_00006fd8;
  int *in_stack_00006ff0;
  int *in_stack_00007020;
  double *in_stack_fffffffffffffd00;
  double *in_stack_fffffffffffffd08;
  long *in_stack_fffffffffffffd10;
  fitsfile *in_stack_fffffffffffffd18;
  long *array;
  fitsfile *in_stack_fffffffffffffd20;
  fitsfile *fptr;
  fitsfile *in_stack_fffffffffffffd28;
  fitsfile *array_00;
  fitsfile *in_stack_fffffffffffffd30;
  int value;
  int *in_stack_fffffffffffffd38;
  fitsfile *nelem;
  undefined4 in_stack_fffffffffffffd40;
  int in_stack_fffffffffffffd44;
  long *value_00;
  int iVar4;
  fitsfile *fptr_00;
  fitsfile *fptr_01;
  uint in_stack_fffffffffffffd60;
  int colnum_00;
  fitsfile *fptr_02;
  char **array_01;
  undefined6 in_stack_fffffffffffffd78;
  undefined2 uVar5;
  int *status_00;
  undefined7 in_stack_fffffffffffffd88;
  undefined1 in_stack_fffffffffffffd8f;
  int *status_01;
  int *in_stack_fffffffffffffd98;
  char *in_stack_fffffffffffffda0;
  LONGLONG in_stack_fffffffffffffda8;
  char *in_stack_fffffffffffffdb0;
  fitsfile *in_stack_fffffffffffffdb8;
  int *in_stack_fffffffffffffdf0;
  char *in_stack_fffffffffffffdf8;
  int *in_stack_fffffffffffffe00;
  fitsfile *in_stack_fffffffffffffe08;
  char local_1c8 [8];
  int *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe54;
  fitsfile *in_stack_fffffffffffffe58;
  fitsfile *in_stack_fffffffffffffe60;
  long local_d0;
  long *local_b8;
  long *local_b0;
  int *local_98;
  int *local_90;
  fitsfile *local_88;
  fitsfile *local_80;
  long local_70;
  long local_68;
  long local_60;
  int local_58;
  int local_48;
  int local_44;
  int local_3c;
  int local_38;
  undefined4 local_34;
  double *local_30;
  int local_24;
  int local_20;
  int local_1c;
  int *local_18;
  int *local_10;
  int local_4;
  
  status_01 = (int *)0x0;
  status_00 = (int *)0x0;
  uVar5 = 5;
  array_01 = (char **)0x0;
  fptr_02 = (fitsfile *)0x0;
  colnum_00 = 0;
  fptr_01 = (fitsfile *)0x0;
  fptr_00 = (fitsfile *)0x0;
  value_00 = (long *)0x0;
  if (*(int *)in_R9 < 1) {
    local_30 = in_R9;
    local_24 = in_R8D;
    local_20 = in_ECX;
    local_1c = in_EDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    if (*in_RDI == *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      if (*(long *)(*(long *)(in_RDI + 2) + 0x88) == -1) {
        ffrdef(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
      }
    }
    else {
      ffmahd((fitsfile *)CONCAT26(5,in_stack_fffffffffffffd78),0,(int *)0x0,
             (int *)(ulong)in_stack_fffffffffffffd60);
    }
    iVar4 = *(int *)(*(long *)(local_10 + 2) + 0x58);
    if (*local_18 == *(int *)(*(long *)(local_18 + 2) + 0x54)) {
      if (*(long *)(*(long *)(local_18 + 2) + 0x88) == -1) {
        ffrdef(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
      }
    }
    else {
      ffmahd((fitsfile *)CONCAT26(uVar5,in_stack_fffffffffffffd78),(int)((ulong)array_01 >> 0x20),
             &fptr_02->HDUposition,(int *)CONCAT44(colnum_00,in_stack_fffffffffffffd60));
    }
    iVar2 = *(int *)(*(long *)(local_18 + 2) + 0x58);
    if (*(int *)local_30 < 1) {
      if ((iVar4 == 0) || (iVar2 == 0)) {
        ffpmsg((char *)0x121f04);
        *(int *)local_30 = 0xeb;
        local_4 = 0xeb;
      }
      else if ((iVar4 == 2) && (iVar2 == 1)) {
        ffpmsg((char *)0x121f42);
        *(int *)local_30 = 0xe3;
        local_4 = 0xe3;
      }
      else {
        ffgtcl(in_stack_fffffffffffffd28,(int)((ulong)in_stack_fffffffffffffd20 >> 0x20),
               &in_stack_fffffffffffffd18->HDUposition,in_stack_fffffffffffffd10,
               (long *)in_stack_fffffffffffffd08,(int *)in_stack_fffffffffffffd00);
        ffeqty(in_stack_fffffffffffffd30,(int)((ulong)in_stack_fffffffffffffd28 >> 0x20),
               &in_stack_fffffffffffffd20->HDUposition,(long *)in_stack_fffffffffffffd18,
               in_stack_fffffffffffffd10,(int *)in_stack_fffffffffffffd08);
        value = (int)((ulong)in_stack_fffffffffffffd30 >> 0x20);
        if (local_3c < 0) {
          ffpmsg((char *)0x121fd6);
          *(int *)local_30 = 0x105;
          local_4 = 0x105;
        }
        else {
          if (local_24 == 0) {
            local_38 = local_20;
            ffgtcl(in_stack_fffffffffffffd28,(int)((ulong)in_stack_fffffffffffffd20 >> 0x20),
                   &in_stack_fffffffffffffd18->HDUposition,in_stack_fffffffffffffd10,
                   (long *)in_stack_fffffffffffffd08,(int *)in_stack_fffffffffffffd00);
            if (local_68 != local_60) {
              ffpmsg((char *)0x1227eb);
              *(int *)local_30 = 0x105;
              return 0x105;
            }
          }
          else {
            local_34 = 0;
            ffkeyn((char *)in_stack_fffffffffffffd38,value,(char *)in_stack_fffffffffffffd28,
                   &in_stack_fffffffffffffd20->HDUposition);
            ffgkys(fptr_01,(char *)fptr_00,(char *)value_00,
                   (char *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                   in_stack_fffffffffffffd38);
            ffkeyn((char *)in_stack_fffffffffffffd38,value,(char *)in_stack_fffffffffffffd28,
                   &in_stack_fffffffffffffd20->HDUposition);
            iVar1 = ffgkys(fptr_01,(char *)fptr_00,(char *)value_00,
                           (char *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                           in_stack_fffffffffffffd38);
            if (iVar1 != 0) {
              ffpmsg((char *)0x1220be);
              *(int *)local_30 = 0xe8;
              return 0xe8;
            }
            if ((iVar4 == 1) && (iVar2 == 2)) {
              if (local_3c == 0x10) {
                ffnkey((int)in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18,
                       (char *)in_stack_fffffffffffffd10,(int *)in_stack_fffffffffffffd08);
              }
              else if (local_3c == 0x29) {
                strcpy(local_1c8,"1J");
              }
              else if (local_3c == 0x15) {
                strcpy(local_1c8,"1I");
              }
              else if (local_3c == 0x2a) {
                strcpy(local_1c8,"1E");
              }
              else if (local_3c == 0x52) {
                strcpy(local_1c8,"1D");
              }
            }
            iVar1 = ffgkyj(fptr_01,(char *)fptr_00,value_00,
                           (char *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                           in_stack_fffffffffffffd38);
            if (iVar1 != 0) {
              ffpmsg((char *)0x1221ee);
              *(int *)local_30 = 0xe6;
              return 0xe6;
            }
            in_stack_fffffffffffffd44 = local_20;
            if (local_58 + 1 < local_20) {
              in_stack_fffffffffffffd44 = local_58 + 1;
            }
            local_38 = in_stack_fffffffffffffd44;
            iVar1 = fficol(in_stack_fffffffffffffd20,(int)((ulong)in_stack_fffffffffffffd18 >> 0x20)
                           ,(char *)in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08,
                           (int *)in_stack_fffffffffffffd00);
            if (0 < iVar1) {
              ffpmsg((char *)0x122284);
              return *(int *)local_30;
            }
            if (((*(long *)(local_10 + 2) == *(long *)(local_18 + 2)) && (*local_10 == *local_18))
               && (local_38 <= local_1c)) {
              local_1c = local_1c + 1;
            }
            local_34 = 0;
            ffkeyn((char *)in_stack_fffffffffffffd38,value,(char *)in_stack_fffffffffffffd28,
                   &in_stack_fffffffffffffd20->HDUposition);
            ffmcom(in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00,
                   in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
            ffkeyn((char *)in_stack_fffffffffffffd38,value,(char *)in_stack_fffffffffffffd28,
                   &in_stack_fffffffffffffd20->HDUposition);
            ffmcom(in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00,
                   in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
            ffcpky(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
                   in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
            ffcpky(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
                   in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
            ffcpky(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
                   in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
            ffcpky(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
                   in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
            ffcpky(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
                   in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
            ffcpky(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
                   in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
            ffcpky(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
                   in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
            ffcpky(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
                   in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
            ffcpky(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
                   in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
            ffcpky(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
                   in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
            ffcpky(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
                   in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
            ffcpky(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
                   in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
            ffcpky(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
                   in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
            if ((iVar4 == 1) && (iVar2 == 2)) {
              if ((local_3c == 0x29) || (local_3c == 0x15)) {
                ffkeyn((char *)in_stack_fffffffffffffd38,value,(char *)in_stack_fffffffffffffd28,
                       &in_stack_fffffffffffffd20->HDUposition);
                iVar2 = ffgkys(fptr_01,(char *)fptr_00,(char *)value_00,
                               (char *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40)
                               ,in_stack_fffffffffffffd38);
                if (iVar2 < 1) {
                  ffkeyn((char *)in_stack_fffffffffffffd38,value,(char *)in_stack_fffffffffffffd28,
                         &in_stack_fffffffffffffd20->HDUposition);
                  if (local_3c == 0x29) {
                    ffpkyj(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
                           in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                           in_stack_fffffffffffffd98);
                  }
                  else {
                    ffpkyj(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
                           in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                           in_stack_fffffffffffffd98);
                  }
                }
              }
            }
            else {
              ffcpky(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe54,
                     in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
            }
            iVar2 = ffrdef(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
            if (iVar2 != 0) {
              return *(int *)local_30;
            }
          }
          ffgkyj(fptr_01,(char *)fptr_00,value_00,
                 (char *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                 in_stack_fffffffffffffd38);
          ffgkyj(fptr_01,(char *)fptr_00,value_00,
                 (char *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                 in_stack_fffffffffffffd38);
          if ((long)local_80 < (long)local_88) {
            local_88 = local_80;
          }
          if (local_3c == 1) {
            local_60 = (local_60 + 7) / 8;
          }
          else if ((local_3c == 0x10) && (iVar4 == 2)) {
            local_60 = local_60 / local_70;
          }
          nelem = local_88;
          ffgrsz(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                 (int *)in_stack_fffffffffffffd08);
          ffgrsz(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                 (int *)in_stack_fffffffffffffd08);
          if ((long)local_90 < (long)local_98) {
            local_98 = local_90;
          }
          if ((long)local_98 / 2 < 1) {
            array_00 = (fitsfile *)0x1;
          }
          else {
            array_00 = (fitsfile *)((long)local_98 / 2);
          }
          fptr = local_88;
          if ((long)array_00 < (long)local_88) {
            fptr = array_00;
          }
          __nmemb = (long *)(local_60 * (long)fptr);
          if (local_3c == 0xe) {
            status_01 = (int *)calloc((size_t)__nmemb,1);
            if (status_01 == (int *)0x0) {
              ffpmsg((char *)0x122a43);
              *(int *)local_30 = 0x6f;
              return 0x6f;
            }
          }
          else if (local_3c == 0x10) {
            status_00 = (int *)calloc((size_t)__nmemb,8);
            for (local_d0 = 0; local_d0 < (long)__nmemb; local_d0 = local_d0 + 1) {
              pvVar3 = calloc(local_70 + 1,1);
              *(void **)(status_00 + local_d0 * 2) = pvVar3;
            }
          }
          else if (local_3c == 0x53) {
            fptr_01 = (fitsfile *)calloc((long)__nmemb * 2,4);
            if (fptr_01 == (fitsfile *)0x0) {
              ffpmsg((char *)0x122b2c);
              *(int *)local_30 = 0x6f;
              return 0x6f;
            }
            colnum_00 = 0;
          }
          else if (local_3c == 0xa3) {
            fptr_02 = (fitsfile *)calloc((long)__nmemb * 2,8);
            if (fptr_02 == (fitsfile *)0x0) {
              ffpmsg((char *)0x122b93);
              *(int *)local_30 = 0x6f;
              return 0x6f;
            }
            array_01 = (char **)0x0;
          }
          else if ((local_3c == 0x51) && (local_44 == 0x50)) {
            value_00 = (long *)calloc((size_t)__nmemb,8);
            if (value_00 == (long *)0x0) {
              ffpmsg((char *)0x122bfe);
              *(int *)local_30 = 0x6f;
              return 0x6f;
            }
          }
          else if ((local_3c == 0x51) && (local_44 != 0x52)) {
            fptr_00 = (fitsfile *)calloc((size_t)__nmemb,8);
            if (fptr_00 == (fitsfile *)0x0) {
              ffpmsg((char *)0x122c60);
              *(int *)local_30 = 0x6f;
              return 0x6f;
            }
          }
          else {
            fptr_02 = (fitsfile *)calloc((size_t)__nmemb,8);
            if (fptr_02 == (fitsfile *)0x0) {
              ffpmsg((char *)0x122cab);
              *(int *)local_30 = 0x6f;
              return 0x6f;
            }
            array_01 = (char **)0xc693b8ab5db65e73;
          }
          local_b8 = (long *)((long)local_88 * local_60);
          array = __nmemb;
          local_b0 = __nmemb;
          if ((long)local_b8 < (long)__nmemb) {
            array = local_b8;
            local_b0 = local_b8;
          }
          while (local_b0 != (long *)0x0) {
            if (local_3c == 0xe) {
              ffgcl((fitsfile *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                    (int)((ulong)nelem >> 0x20),(LONGLONG)local_98,(LONGLONG)array_00,(LONGLONG)fptr
                    ,(char *)array,&fptr_00->HDUposition);
            }
            else {
              iVar4 = (int)((ulong)value_00 >> 0x20);
              if (local_3c == 0x10) {
                in_stack_fffffffffffffd00 = (double *)&local_48;
                in_stack_fffffffffffffd08 = local_30;
                ffgcvs(fptr_00,iVar4,CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                       (LONGLONG)nelem,(LONGLONG)local_98,(char *)array_00,array_01,
                       (int *)CONCAT26(uVar5,in_stack_fffffffffffffd78),status_00);
              }
              else {
                iVar2 = (int)((ulong)fptr_00 >> 0x20);
                in_stack_fffffffffffffd00 = local_30;
                if (local_3c == 0x53) {
                  ffgcvc(fptr_01,iVar2,(LONGLONG)value_00,
                         CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                         (LONGLONG)nelem,(float)((ulong)local_98 >> 0x20),(float *)array_00,
                         (int *)array_01,(int *)CONCAT26(uVar5,in_stack_fffffffffffffd78));
                }
                else if (local_3c == 0xa3) {
                  ffgcvm(fptr_01,iVar2,(LONGLONG)value_00,
                         CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                         (LONGLONG)nelem,(double)local_98,(double *)array_00,(int *)array_01,
                         (int *)CONCAT26(uVar5,in_stack_fffffffffffffd78));
                }
                else if ((local_3c == 0x51) && (local_44 == 0x50)) {
                  in_stack_fffffffffffffd00 = (double *)&local_48;
                  in_stack_fffffffffffffd08 = local_30;
                  ffgcvujj(fptr_00,iVar4,
                           CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                           (LONGLONG)nelem,(LONGLONG)local_98,(ULONGLONG)array_00,
                           (ULONGLONG *)array_01,(int *)CONCAT26(uVar5,in_stack_fffffffffffffd78),
                           status_00);
                }
                else if ((local_3c == 0x51) && (local_44 != 0x52)) {
                  in_stack_fffffffffffffd00 = (double *)&local_48;
                  in_stack_fffffffffffffd08 = local_30;
                  ffgcvjj(fptr_00,iVar4,
                          CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                          (LONGLONG)nelem,(LONGLONG)local_98,(LONGLONG)array_00,(LONGLONG *)array_01
                          ,(int *)CONCAT26(uVar5,in_stack_fffffffffffffd78),status_00);
                }
                else {
                  ffgcvd(fptr_01,iVar2,(LONGLONG)value_00,
                         CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                         (LONGLONG)nelem,(double)local_98,(double *)array_00,(int *)array_01,
                         (int *)CONCAT26(uVar5,in_stack_fffffffffffffd78));
                }
              }
            }
            if (0 < *(int *)local_30) {
              ffpmsg((char *)0x123059);
              break;
            }
            if (local_3c == 0xe) {
              in_stack_fffffffffffffd8f = 2;
              in_stack_fffffffffffffd00 = local_30;
              ffpcnl(fptr_02,colnum_00,(LONGLONG)fptr_01,(LONGLONG)fptr_00,(LONGLONG)value_00,
                     (char *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                     (char)status_00,(int *)CONCAT17(2,in_stack_fffffffffffffd88));
            }
            else if (local_3c == 0x10) {
              if (local_48 == 0) {
                ffpcls(in_stack_00006fd8,in_stack_00006fd4,in_stack_00006fc8,in_stack_00006fc0,
                       in_stack_00006fb8,in_stack_00006fb0,in_stack_00007020);
              }
              else {
                in_stack_fffffffffffffd00 = local_30;
                ffpcns(fptr_02,colnum_00,(LONGLONG)fptr_01,(LONGLONG)fptr_00,(LONGLONG)value_00,
                       (char **)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                       (char *)status_00,
                       (int *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
              }
            }
            else {
              iVar4 = (int)((ulong)array >> 0x20);
              if (local_3c == 0x53) {
                ffpclc(fptr,iVar4,(LONGLONG)in_stack_fffffffffffffd10,
                       (LONGLONG)in_stack_fffffffffffffd08,(LONGLONG)in_stack_fffffffffffffd00,
                       (float *)local_30,local_98);
              }
              else if (local_3c == 0xa3) {
                ffpclm(fptr,iVar4,(LONGLONG)in_stack_fffffffffffffd10,
                       (LONGLONG)in_stack_fffffffffffffd08,(LONGLONG)in_stack_fffffffffffffd00,
                       local_30,local_98);
              }
              else if ((local_3c == 0x51) && (local_44 == 0x50)) {
                ffpclujj(in_stack_00006fa8,in_stack_00006fa4,in_stack_00006f98,in_stack_00006f90,
                         in_stack_00006f88,(ULONGLONG *)in_stack_00006f80,in_stack_00006ff0);
              }
              else if ((local_3c == 0x51) && (local_44 != 0x52)) {
                ffpcljj(in_stack_00006fa8,in_stack_00006fa4,in_stack_00006f98,in_stack_00006f90,
                        in_stack_00006f88,(LONGLONG *)in_stack_00006f80,in_stack_00006ff0);
              }
              else if (local_48 == 0) {
                ffpcld(in_stack_00006fa8,in_stack_00006fa4,in_stack_00006f98,in_stack_00006f90,
                       in_stack_00006f88,in_stack_00006f80,in_stack_00006ff0);
              }
              else {
                ffpcnd((fitsfile *)CONCAT26(uVar5,in_stack_fffffffffffffd78),
                       (int)((ulong)array_01 >> 0x20),(LONGLONG)fptr_02,
                       CONCAT44(colnum_00,in_stack_fffffffffffffd60),(LONGLONG)fptr_01,
                       (double *)fptr_00,(double)value_00,status_01);
              }
            }
            if (0 < *(int *)local_30) {
              ffpmsg((char *)0x12336a);
              break;
            }
            local_b8 = (long *)((long)local_b8 - (long)local_b0);
            in_stack_fffffffffffffd10 = __nmemb;
            local_b0 = __nmemb;
            if ((long)local_b8 < (long)__nmemb) {
              in_stack_fffffffffffffd10 = local_b8;
              local_b0 = local_b8;
            }
          }
          if (local_3c == 0xe) {
            free(status_01);
          }
          else if (local_3c == 0x10) {
            for (local_d0 = 0; local_d0 < (long)__nmemb; local_d0 = local_d0 + 1) {
              free(*(void **)(status_00 + local_d0 * 2));
            }
            free(status_00);
          }
          if (value_00 != (long *)0x0) {
            free(value_00);
          }
          if (fptr_00 != (fitsfile *)0x0) {
            free(fptr_00);
          }
          if (fptr_02 != (fitsfile *)0x0) {
            free(fptr_02);
          }
          local_4 = *(int *)local_30;
        }
      }
    }
    else {
      local_4 = *(int *)local_30;
    }
  }
  else {
    local_4 = *(int *)in_R9;
  }
  return local_4;
}

Assistant:

int ffcpcl(fitsfile *infptr,    /* I - FITS file pointer to input file  */
           fitsfile *outfptr,   /* I - FITS file pointer to output file */
           int incol,           /* I - number of input column   */
           int outcol,          /* I - number for output column  */
           int create_col,      /* I - create new col if TRUE, else overwrite */
           int *status)         /* IO - error status     */
/*
  copy a column from infptr and insert it in the outfptr table.
*/
{
    int tstatus, colnum, typecode, otypecode, etypecode, anynull;
    int inHduType, outHduType;
    long tfields, repeat, orepeat, width, owidth, nrows, outrows;
    long inloop, outloop, maxloop, ndone, ntodo, npixels;
    long firstrow, firstelem, ii;
    char keyname[FLEN_KEYWORD], ttype[FLEN_VALUE], tform[FLEN_VALUE];
    char ttype_comm[FLEN_COMMENT],tform_comm[FLEN_COMMENT];
    char *lvalues = 0, nullflag, **strarray = 0;
    char nulstr[] = {'\5', '\0'};  /* unique null string value */
    double dnull = 0.l, *dvalues = 0;
    float fnull = 0., *fvalues = 0;
    long long int *jjvalues = 0;
    unsigned long long int *ujjvalues = 0;

    if (*status > 0)
        return(*status);

    if (infptr->HDUposition != (infptr->Fptr)->curhdu)
    {
        ffmahd(infptr, (infptr->HDUposition) + 1, NULL, status);
    }
    else if ((infptr->Fptr)->datastart == DATA_UNDEFINED)
        ffrdef(infptr, status);                /* rescan header */
    inHduType = (infptr->Fptr)->hdutype;
    
    if (outfptr->HDUposition != (outfptr->Fptr)->curhdu)
    {
        ffmahd(outfptr, (outfptr->HDUposition) + 1, NULL, status);
    }
    else if ((outfptr->Fptr)->datastart == DATA_UNDEFINED)
        ffrdef(outfptr, status);               /* rescan header */
    outHduType = (outfptr->Fptr)->hdutype;
    
    if (*status > 0)
        return(*status);

    if (inHduType == IMAGE_HDU || outHduType == IMAGE_HDU)
    {
       ffpmsg
       ("Can not copy columns to or from IMAGE HDUs (ffcpcl)");
       return(*status = NOT_TABLE);
    }

    if ( inHduType == BINARY_TBL &&  outHduType == ASCII_TBL)
    {
       ffpmsg
       ("Copying from Binary table to ASCII table is not supported (ffcpcl)");
       return(*status = NOT_BTABLE);
    }

    /* get the datatype and vector repeat length of the column */
    ffgtcl(infptr, incol, &typecode, &repeat, &width, status);
    /* ... and equivalent type code */
    ffeqty(infptr, incol, &etypecode, 0,      0,      status);

    if (typecode < 0)
    {
        ffpmsg("Variable-length columns are not supported (ffcpcl)");
        return(*status = BAD_TFORM);
    }

    if (create_col)    /* insert new column in output table? */
    {
        tstatus = 0;
        ffkeyn("TTYPE", incol, keyname, &tstatus);
        ffgkys(infptr, keyname, ttype, ttype_comm, &tstatus);
        ffkeyn("TFORM", incol, keyname, &tstatus);
    
        if (ffgkys(infptr, keyname, tform, tform_comm, &tstatus) )
        {
          ffpmsg
          ("Could not find TTYPE and TFORM keywords in input table (ffcpcl)");
          return(*status = NO_TFORM);
        }

        if (inHduType == ASCII_TBL && outHduType == BINARY_TBL)
        {
            /* convert from ASCII table to BINARY table format string */
            if (typecode == TSTRING)
                ffnkey(width, "A", tform, status);

            else if (typecode == TLONG)
                strcpy(tform, "1J");

            else if (typecode == TSHORT)
                strcpy(tform, "1I");

            else if (typecode == TFLOAT)
                strcpy(tform,"1E");

            else if (typecode == TDOUBLE)
                strcpy(tform,"1D");
        }

        if (ffgkyj(outfptr, "TFIELDS", &tfields, 0, &tstatus))
        {
           ffpmsg
           ("Could not read TFIELDS keyword in output table (ffcpcl)");
           return(*status = NO_TFIELDS);
        }

        colnum = minvalue((int) tfields + 1, outcol); /* output col. number */

        /* create the empty column */
        if (fficol(outfptr, colnum, ttype, tform, status) > 0)
        {
           ffpmsg
           ("Could not append new column to output file (ffcpcl)");
           return(*status);
        }

        if ((infptr->Fptr == outfptr->Fptr)
           && (infptr->HDUposition == outfptr->HDUposition)
           && (colnum <= incol))  {
	       incol++;  /* the input column has been shifted over */
        }

        /* copy the comment strings from the input file for TTYPE and TFORM */
        tstatus = 0;
        ffkeyn("TTYPE", colnum, keyname, &tstatus);
        ffmcom(outfptr, keyname, ttype_comm, &tstatus);
        ffkeyn("TFORM", colnum, keyname, &tstatus);
        ffmcom(outfptr, keyname, tform_comm, &tstatus);

        /* copy other column-related keywords if they exist */

        ffcpky(infptr, outfptr, incol, colnum, "TUNIT", status);
        ffcpky(infptr, outfptr, incol, colnum, "TSCAL", status);
        ffcpky(infptr, outfptr, incol, colnum, "TZERO", status);
        ffcpky(infptr, outfptr, incol, colnum, "TDISP", status);
        ffcpky(infptr, outfptr, incol, colnum, "TLMIN", status);
        ffcpky(infptr, outfptr, incol, colnum, "TLMAX", status);
        ffcpky(infptr, outfptr, incol, colnum, "TDIM", status);

        /*  WCS keywords */
        ffcpky(infptr, outfptr, incol, colnum, "TCTYP", status);
        ffcpky(infptr, outfptr, incol, colnum, "TCUNI", status);
        ffcpky(infptr, outfptr, incol, colnum, "TCRVL", status);
        ffcpky(infptr, outfptr, incol, colnum, "TCRPX", status);
        ffcpky(infptr, outfptr, incol, colnum, "TCDLT", status);
        ffcpky(infptr, outfptr, incol, colnum, "TCROT", status);

        if (inHduType == ASCII_TBL && outHduType == BINARY_TBL)
        {
            /* binary tables only have TNULLn keyword for integer columns */
            if (typecode == TLONG || typecode == TSHORT)
            {
                /* check if null string is defined; replace with integer */
                ffkeyn("TNULL", incol, keyname, &tstatus);
                if (ffgkys(infptr, keyname, ttype, 0, &tstatus) <= 0)
                {
                   ffkeyn("TNULL", colnum, keyname, &tstatus);
                   if (typecode == TLONG)
                      ffpkyj(outfptr, keyname, -9999999L, "Null value", status);
                   else
                      ffpkyj(outfptr, keyname, -32768L, "Null value", status);
                }
            }
        }
        else
        {
            ffcpky(infptr, outfptr, incol, colnum, "TNULL", status);
        }

        /* rescan header to recognize the new keywords */
        if (ffrdef(outfptr, status) )
            return(*status);
    }
    else
    {
        colnum = outcol;
        /* get the datatype and vector repeat length of the output column */
        ffgtcl(outfptr, outcol, &otypecode, &orepeat, &owidth, status);

        if (orepeat != repeat) {
            ffpmsg("Input and output vector columns must have same length (ffcpcl)");
            return(*status = BAD_TFORM);
        }
    }

    ffgkyj(infptr,  "NAXIS2", &nrows,   0, status);  /* no. of input rows */
    ffgkyj(outfptr, "NAXIS2", &outrows, 0, status);  /* no. of output rows */
    nrows = minvalue(nrows, outrows);

    if (typecode == TBIT)
        repeat = (repeat + 7) / 8;  /* convert from bits to bytes */
    else if (typecode == TSTRING && inHduType == BINARY_TBL)
        repeat = repeat / width;  /* convert from chars to unit strings */

    /* get optimum number of rows to copy at one time */
    ffgrsz(infptr,  &inloop,  status);
    ffgrsz(outfptr, &outloop, status);

    /* adjust optimum number, since 2 tables are open at once */
    maxloop = minvalue(inloop, outloop); /* smallest of the 2 tables */
    maxloop = maxvalue(1, maxloop / 2);  /* at least 1 row */
    maxloop = minvalue(maxloop, nrows);  /* max = nrows to be copied */
    maxloop *= repeat;                   /* mult by no of elements in a row */

    /* allocate memory for arrays */
    if (typecode == TLOGICAL)
    {
       lvalues   = (char *) calloc(maxloop, sizeof(char) );
       if (!lvalues)
       {
         ffpmsg
         ("malloc failed to get memory for logicals (ffcpcl)");
         return(*status = ARRAY_TOO_BIG);
       }
    }
    else if (typecode == TSTRING)
    {
       /* allocate array of pointers */
       strarray = (char **) calloc(maxloop, sizeof(strarray));

       /* allocate space for each string */
       for (ii = 0; ii < maxloop; ii++)
          strarray[ii] = (char *) calloc(width+1, sizeof(char));
    }
    else if (typecode == TCOMPLEX)
    {
       fvalues = (float *) calloc(maxloop * 2, sizeof(float) );
       if (!fvalues)
       {
         ffpmsg
         ("malloc failed to get memory for complex (ffcpcl)");
         return(*status = ARRAY_TOO_BIG);
       }
       fnull = 0.;
    }
    else if (typecode == TDBLCOMPLEX)
    {
       dvalues = (double *) calloc(maxloop * 2, sizeof(double) );
       if (!dvalues)
       {
         ffpmsg
         ("malloc failed to get memory for dbl complex (ffcpcl)");
         return(*status = ARRAY_TOO_BIG);
       }
       dnull = 0.;
    }
    /* These are unsigned long-long ints that are not rescaled to floating point numbers */
    else if (typecode == TLONGLONG && etypecode == TULONGLONG) {

       ujjvalues = (unsigned long long int *) calloc(maxloop, sizeof(unsigned long long int) );
       if (!ujjvalues)
       {
         ffpmsg
         ("malloc failed to get memory for unsigned long long int (ffcpcl)");
         return(*status = ARRAY_TOO_BIG);
       }
    }
    /* These are long-long ints that are not rescaled to floating point numbers */
    else if (typecode == TLONGLONG && etypecode != TDOUBLE) {

       jjvalues = (long long int *) calloc(maxloop, sizeof(long long int) );
       if (!jjvalues)
       {
         ffpmsg
         ("malloc failed to get memory for long long int (ffcpcl)");
         return(*status = ARRAY_TOO_BIG);
       }
    }
    else    /* other numerical datatype; read them all as doubles */
    {
       dvalues = (double *) calloc(maxloop, sizeof(double) );
       if (!dvalues)
       {
         ffpmsg
         ("malloc failed to get memory for doubles (ffcpcl)");
         return(*status = ARRAY_TOO_BIG);
       }
         dnull = -9.99991999E31;  /* use an unlikely value for nulls */
    }

    npixels = nrows * repeat;          /* total no. of pixels to copy */
    ntodo = minvalue(npixels, maxloop);   /* no. to copy per iteration */
    ndone = 0;             /* total no. of pixels that have been copied */

    while (ntodo)      /* iterate through the table */
    {
        firstrow = ndone / repeat + 1;
        firstelem = ndone - ((firstrow - 1) * repeat) + 1;

        /* read from input table */
        if (typecode == TLOGICAL)
            ffgcl(infptr, incol, firstrow, firstelem, ntodo, 
                       lvalues, status);
        else if (typecode == TSTRING)
            ffgcvs(infptr, incol, firstrow, firstelem, ntodo,
                       nulstr, strarray, &anynull, status);

        else if (typecode == TCOMPLEX)  
            ffgcvc(infptr, incol, firstrow, firstelem, ntodo, fnull, 
                   fvalues, &anynull, status);

        else if (typecode == TDBLCOMPLEX)
            ffgcvm(infptr, incol, firstrow, firstelem, ntodo, dnull, 
                   dvalues, &anynull, status);

	/* Neither TULONGLONG nor TLONGLONG does null checking.  Whatever
	   null value is in input table is transferred to output table
	   without checking.  Since the TNULL value was copied, this
	   should preserve null values */
	else if (typecode == TLONGLONG && etypecode == TULONGLONG)
	  ffgcvujj(infptr, incol, firstrow, firstelem, ntodo, /*nulval*/ 0,
                   ujjvalues, &anynull, status);

	else if (typecode == TLONGLONG && etypecode != TDOUBLE) 
	  ffgcvjj(infptr, incol, firstrow, firstelem, ntodo, /*nulval*/ 0, 
                   jjvalues, &anynull, status);

        else       /* all numerical types */
            ffgcvd(infptr, incol, firstrow, firstelem, ntodo, dnull, 
                   dvalues, &anynull, status);

        if (*status > 0)
        {
            ffpmsg("Error reading input copy of column (ffcpcl)");
            break;
        }

        /* write to output table */
        if (typecode == TLOGICAL)
        {
            nullflag = 2;

            ffpcnl(outfptr, colnum, firstrow, firstelem, ntodo, 
                       lvalues, nullflag, status);

        }

        else if (typecode == TSTRING)
        {
            if (anynull)
                ffpcns(outfptr, colnum, firstrow, firstelem, ntodo,
                       strarray, nulstr, status);
            else
                ffpcls(outfptr, colnum, firstrow, firstelem, ntodo,
                       strarray, status);
        }

        else if (typecode == TCOMPLEX)  
        {                      /* doesn't support writing nulls */
            ffpclc(outfptr, colnum, firstrow, firstelem, ntodo, 
                       fvalues, status);
        }

        else if (typecode == TDBLCOMPLEX)  
        {                      /* doesn't support writing nulls */
            ffpclm(outfptr, colnum, firstrow, firstelem, ntodo, 
                       dvalues, status);
        }

	else if (typecode == TLONGLONG && etypecode == TULONGLONG)
	{   /* No null checking because we did none to read */
            ffpclujj(outfptr, colnum, firstrow, firstelem, ntodo, 
		     ujjvalues, status);
	}
	else if (typecode == TLONGLONG && etypecode != TDOUBLE) 
	{   /* No null checking because we did none to read */
	    ffpcljj(outfptr, colnum, firstrow, firstelem, ntodo, 
		    jjvalues, status);
	}
        else  /* all other numerical types */
        {
            if (anynull)
                ffpcnd(outfptr, colnum, firstrow, firstelem, ntodo, 
                       dvalues, dnull, status);
            else
                ffpcld(outfptr, colnum, firstrow, firstelem, ntodo, 
                       dvalues, status);
        }

        if (*status > 0)
        {
            ffpmsg("Error writing output copy of column (ffcpcl)");
            break;
        }

        npixels -= ntodo;
        ndone += ntodo;
        ntodo = minvalue(npixels, maxloop);
    }

    /* free the previously allocated memory */
    if (typecode == TLOGICAL)
    {
        free(lvalues);
    }
    else if (typecode == TSTRING)
    {
         for (ii = 0; ii < maxloop; ii++)
             free(strarray[ii]);

         free(strarray);
    }
    if (ujjvalues) free(ujjvalues);
    if (jjvalues)  free(jjvalues);
    if (dvalues)   free(dvalues);

    return(*status);
}